

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int get_entry_uname(archive_write *a,archive_entry *entry,char **name,size_t *length,
                   archive_string_conv *sc)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  
  wVar1 = _archive_entry_uname_l(entry,name,length,sc);
  if (wVar1 == L'\0') {
    iVar2 = 0;
  }
  else {
    piVar3 = __errno_location();
    iVar2 = -0x14;
    if (*piVar3 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Uname");
      iVar2 = -0x1e;
    }
  }
  return iVar2;
}

Assistant:

static int
get_entry_uname(struct archive_write *a, struct archive_entry *entry,
    const char **name, size_t *length, struct archive_string_conv *sc)
{
	int r;

	r = archive_entry_uname_l(entry, name, length, sc);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}